

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode o3dgc::LoadBinAC(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long size_00;
  ulong local_a0;
  ulong local_98;
  unsigned_long i;
  Adaptive_Bit_Model bModel;
  undefined1 local_70 [8];
  Arithmetic_Codec acd;
  uchar *buffer;
  unsigned_long size;
  unsigned_long sizeSize;
  unsigned_long *iterator_local;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  
  uVar2 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  size_00 = BinaryStream::ReadUInt32Bin(bstream,iterator);
  if (size_00 != 0) {
    acd.mode = 0;
    acd._44_4_ = 0;
    BinaryStream::GetBuffer(bstream,*iterator,(uchar **)&acd.mode);
    *iterator = *iterator + (uVar2 - 8);
    Vector<long>::Allocate(data,size_00);
    Arithmetic_Codec::Arithmetic_Codec((Arithmetic_Codec *)local_70);
    size._0_4_ = (uint)(uVar2 - 8);
    Arithmetic_Codec::set_buffer((Arithmetic_Codec *)local_70,(uint)size,(uchar *)acd._40_8_);
    Arithmetic_Codec::start_decoder((Arithmetic_Codec *)local_70);
    Adaptive_Bit_Model::Adaptive_Bit_Model((Adaptive_Bit_Model *)&i);
    for (local_98 = 0; local_98 < size_00; local_98 = local_98 + 1) {
      uVar1 = Arithmetic_Codec::decode((Arithmetic_Codec *)local_70,(Adaptive_Bit_Model *)&i);
      local_a0 = (ulong)uVar1;
      Vector<long>::PushBack(data,(long *)&local_a0);
    }
    Arithmetic_Codec::~Arithmetic_Codec((Arithmetic_Codec *)local_70);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadBinAC(Vector<long> & data,
                                const BinaryStream & bstream,
                                unsigned long & iterator) 
    {
        unsigned long sizeSize = bstream.ReadUInt32Bin(iterator) - 8;
        unsigned long size     = bstream.ReadUInt32Bin(iterator);
        if (size == 0)
        {
            return O3DGC_OK;
        }
        unsigned char * buffer = 0;
        bstream.GetBuffer(iterator, buffer);
        iterator += sizeSize;
        data.Allocate(size);
        Arithmetic_Codec acd;
        acd.set_buffer(sizeSize, buffer);
        acd.start_decoder();
        Adaptive_Bit_Model bModel;
#ifdef DEBUG_VERBOSE
        printf("-----------\nsize %i\n", size);
        fprintf(g_fileDebugTF, "size %i\n", size);
#endif //DEBUG_VERBOSE
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(acd.decode(bModel));
#ifdef DEBUG_VERBOSE
            printf("%i\t%i\n", i, data[i]);
            fprintf(g_fileDebugTF, "%i\t%i\n", i, data[i]);
#endif //DEBUG_VERBOSE
        }
        return O3DGC_OK;
    }